

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owner.cpp
# Opt level: O0

optional<unsigned_int> fs_stat_gid(string_view path)

{
  int iVar1;
  const_pointer pvVar2;
  int *piVar3;
  undefined1 local_1b8 [8];
  stat s;
  statx sx;
  undefined1 auStack_20 [4];
  int r;
  string_view path_local;
  
  path_local._M_len = (size_t)path._M_str;
  _auStack_20 = path._M_len;
  sx.__spare3[0xb]._4_4_ = 0;
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  sx.__spare3[0xb]._4_4_ = statx(0xffffff9c,pvVar2,0x800,0x10,s.__glibc_reserved + 2);
  if (sx.__spare3[0xb]._4_4_ == 0) {
    std::optional<unsigned_int>::optional<unsigned_int_&,_true>
              ((optional<unsigned_int> *)&path_local._M_str,&sx.stx_nlink);
  }
  else {
    if ((sx.__spare3[0xb]._4_4_ == 0) || (piVar3 = __errno_location(), *piVar3 == 0x26)) {
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
      iVar1 = stat(pvVar2,(stat *)local_1b8);
      if (iVar1 == 0) {
        std::optional<unsigned_int>::optional<unsigned_int_&,_true>
                  ((optional<unsigned_int> *)&path_local._M_str,&s.st_mode);
        return (_Optional_base<unsigned_int,_true,_true>)
               (_Optional_base<unsigned_int,_true,_true>)path_local._M_str;
      }
    }
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&path_local._M_str);
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)path_local._M_str;
}

Assistant:

static std::optional<gid_t> fs_stat_gid(std::string_view path)
{
  int r = 0;
#if defined(STATX_GID) && defined(USE_STATX)
  struct statx sx;
  r = statx(AT_FDCWD, path.data(), AT_NO_AUTOMOUNT, STATX_GID, &sx);
  if (r == 0)
    return sx.stx_gid;
#endif

if(r == 0 || errno == ENOSYS){
  if(struct stat s; !stat(path.data(), &s))
    return s.st_gid;
}

  return {};
}